

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_allIndexesOf
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  uint uVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  shared_ptr<Instance> *lhs;
  uint __len;
  string *psVar6;
  ulong __val;
  long lVar7;
  ulong uVar8;
  string __str;
  string indexes_str;
  shared_ptr<Instance> instance;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string *local_48;
  shared_ptr<Instance> local_40;
  
  local_48 = __return_storage_ptr__;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  psVar6 = (string *)&local_40;
  get_shared_instance(psVar6,&this->_element_type);
  local_68._M_allocated_capacity = (size_type)&local_58;
  local_68._8_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  lhs = (this->_value).
        super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (lhs != (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar2 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)psVar6,lhs,&local_40);
      if (bVar2) {
        if (local_68._8_8_ != 0) {
          std::__cxx11::string::append(local_68._M_local_buf);
        }
        lVar7 = (long)lhs -
                (long)(this->_value).
                      super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = lVar7 >> 4;
        __val = -uVar8;
        if (0 < (long)uVar8) {
          __val = uVar8;
        }
        __len = 1;
        if (9 < __val) {
          uVar8 = __val;
          uVar1 = 4;
          do {
            __len = uVar1;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_00148b5a;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_00148b5a;
            }
            if (uVar8 < 10000) goto LAB_00148b5a;
            bVar2 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            uVar1 = __len + 4;
          } while (bVar2);
          __len = __len + 1;
        }
LAB_00148b5a:
        local_88._0_8_ = local_88 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_88,(char)__len - (char)(lVar7 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)(local_88._0_8_ + -(lVar7 >> 0x3f)),__len,__val);
        std::__cxx11::string::_M_append(local_68._M_local_buf,local_88._0_8_);
        psVar6 = (string *)local_88._0_8_;
        if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_);
        }
      }
      lhs = lhs + 1;
    } while (lhs != (this->_value).
                    super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,"[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
  plVar3 = (long *)std::__cxx11::string::append(local_88);
  psVar6 = local_48;
  (local_48->_M_dataplus)._M_p = (pointer)&local_48->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar7 = plVar3[3];
    (local_48->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&local_48->field_2 + 8) = lVar7;
  }
  else {
    (local_48->_M_dataplus)._M_p = (pointer)*plVar3;
    (local_48->field_2)._M_allocated_capacity = *psVar5;
  }
  local_48->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_allocated_capacity != &local_58) {
    operator_delete((void *)local_68._M_allocated_capacity);
  }
  if (local_40.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return psVar6;
}

Assistant:

std::string VectorInstance::op_allIndexesOf(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::string indexes_str;
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            if (indexes_str.size() > 0)
                indexes_str += ",";
            indexes_str += std::to_string(it - _value.begin());
        }
    return "[" + indexes_str + "]";
}